

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# privsock.c
# Opt level: O0

int priv_sock_get_int(int fd)

{
  ssize_t sVar1;
  int local_10;
  int ret;
  int res;
  int fd_local;
  
  ret = fd;
  sVar1 = readn(fd,&local_10,4);
  if ((int)sVar1 != 4) {
    fprintf(_stderr,"priv_sock_get_result error\n");
    exit(1);
  }
  return local_10;
}

Assistant:

int priv_sock_get_int(int fd) {
  int res;
  int ret;
  ret = readn(fd, &res, sizeof(res));
  if (ret != sizeof(res)) {
    fprintf(stderr, "priv_sock_get_result error\n");
    exit(EXIT_FAILURE);
  }
  return res;
}